

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O1

void __thiscall
TPZDohrAssembly<std::complex<long_double>_>::ExtractCoarse
          (TPZDohrAssembly<std::complex<long_double>_> *this,int isub,
          TPZFMatrix<std::complex<long_double>_> *global,
          TPZFMatrix<std::complex<long_double>_> *local)

{
  undefined8 *puVar1;
  TPZVec<int> *pTVar2;
  ulong uVar3;
  ulong uVar4;
  complex<long_double> *pcVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pTVar2 = (this->fCoarseEqs).fStore;
  uVar3 = pTVar2[isub].fNElements;
  uVar4 = (global->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  iVar6 = (int)uVar3;
  iVar8 = (int)uVar4;
  (*(local->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(local,(long)iVar6,(long)iVar8);
  if (0 < iVar8) {
    lVar12 = 0;
    uVar10 = 0;
    do {
      if (0 < iVar6) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          (*(global->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,global,(long)*(int *)((long)pTVar2[isub].fStore + lVar11),uVar10);
          if (((local->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <=
               (long)uVar9) ||
             ((local->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
              (long)uVar10)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar7 = (local->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow *
                  lVar12;
          pcVar5 = local->fElem;
          puVar1 = (undefined8 *)(pcVar5->_M_value + lVar11 * 8 + lVar7 + 0x10);
          *puVar1 = local_48;
          puVar1[1] = uStack_40;
          puVar1 = (undefined8 *)(pcVar5->_M_value + lVar11 * 8 + lVar7);
          *puVar1 = local_58;
          puVar1[1] = uStack_50;
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 4;
        } while ((uVar3 & 0x7fffffff) != uVar9);
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar10 != (uVar4 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}